

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeDisplay.cpp
# Opt level: O3

void __thiscall eglu::NativeDisplay::~NativeDisplay(NativeDisplay *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

NativeDisplay::~NativeDisplay (void)
{
}